

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::test(FastText *this,istream *in,int32_t k)

{
  int iVar1;
  int iVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  ostream *poVar4;
  long *plVar5;
  int iVar6;
  pointer ppVar7;
  ulong uVar8;
  vector<int,_std::allocator<int>_> labels;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> modelPredictions;
  vector<int,_std::allocator<int>_> line;
  vector<int,_std::allocator<int>_> local_98;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_78;
  double local_58;
  undefined8 uStack_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = 0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58 = 0.0;
  uStack_50 = 0;
  iVar2 = 0;
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,&local_48,&local_98,
                        &((this->model_).
                          super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         rng);
    Dictionary::addNgrams
              ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_48,
               ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->wordNgrams);
    if ((local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish !=
         local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) &&
       (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start)) {
      local_78.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Model::predict((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_48,k,&local_78);
      for (ppVar7 = local_78.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar7 != local_78.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&ppVar7->second);
        local_58 = (double)((ulong)(_Var3._M_current ==
                                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish) * (long)local_58 +
                           (ulong)(_Var3._M_current !=
                                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish) * (long)(local_58 + 1.0));
        uStack_50 = 0;
      }
      uVar8 = (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (local_78.
          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar2 = iVar2 + 1;
      iVar6 = iVar6 + (int)(uVar8 >> 2);
    }
  }
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P@",2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  poVar4 = std::ostream::_M_insert<double>(local_58 / (double)(iVar2 * k));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R@",2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  poVar4 = std::ostream::_M_insert<double>(local_58 / (double)iVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of examples: ",0x14);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k) {
  int32_t nexamples = 0, nlabels = 0;
  double precision = 0.0;
  std::vector<int32_t> line, labels;

  while (in.peek() != EOF) {
    dict_->getLine(in, line, labels, model_->rng);
    dict_->addNgrams(line, args_->wordNgrams);
    if (labels.size() > 0 && line.size() > 0) {
      std::vector<std::pair<real, int32_t>> modelPredictions;
      model_->predict(line, k, modelPredictions);
      for (auto it = modelPredictions.cbegin(); it != modelPredictions.cend(); it++) {
        if (std::find(labels.begin(), labels.end(), it->second) != labels.end()) {
          precision += 1.0;
        }
      }
      nexamples++;
      nlabels += labels.size();
    }
  }
  std::cout << std::setprecision(3);
  std::cout << "P@" << k << ": " << precision / (k * nexamples) << std::endl;
  std::cout << "R@" << k << ": " << precision / nlabels << std::endl;
  std::cout << "Number of examples: " << nexamples << std::endl;
}